

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::make_marginal<false>(data *sm,example *ec)

{
  byte bVar1;
  vw *pvVar2;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar4;
  float *pfVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  long lVar10;
  uint64_t *puVar11;
  ulong *puVar12;
  features *pfVar13;
  key_type *pkVar14;
  features *pfVar15;
  features *pfVar16;
  ulong i;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  float *pfVar17;
  float *pfVar18;
  byte bVar19;
  float fVar20;
  uint64_t key;
  key_type local_108;
  example *local_100;
  double local_f8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f0;
  byte *local_e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 uStack_c8;
  undefined4 local_c4;
  features *local_c0;
  features *local_b8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  uint64_t local_a8;
  features *local_a0;
  key_type local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  float local_38;
  
  bVar19 = 0;
  pvVar2 = sm->all;
  puVar11 = &(pvVar2->weights).dense_weights._weight_mask;
  if ((pvVar2->weights).sparse != false) {
    puVar11 = &(pvVar2->weights).sparse_weights._weight_mask;
  }
  local_a8 = *puVar11;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_e8 = (ec->super_example_predict).indices._begin;
  if (local_e8 != (ec->super_example_predict).indices._end) {
    local_b8 = (ec->super_example_predict).feature_space;
    local_c0 = sm->temp;
    local_e0 = &(sm->marginals)._M_h;
    local_f0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&sm->expert_state;
    local_100 = ec;
    do {
      pfVar4 = local_c0;
      bVar1 = *local_e8;
      if (sm->id_features[bVar1] == true) {
        pfVar16 = local_c0 + bVar1;
        pfVar13 = pfVar16;
        pkVar14 = &local_98;
        for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
          *pkVar14 = (key_type)(pfVar13->values)._begin;
          pfVar13 = (features *)((long)pfVar13 + (ulong)bVar19 * -0x10 + 8);
          pkVar14 = pkVar14 + (ulong)bVar19 * -2 + 1;
        }
        pfVar13 = local_b8 + bVar1;
        pfVar15 = pfVar16;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pfVar15->values)._begin = (pfVar13->values)._begin;
          pfVar13 = (features *)((long)pfVar13 + (ulong)bVar19 * -0x10 + 8);
          pfVar15 = (features *)((long)pfVar15 + (ulong)bVar19 * -0x10 + 8);
        }
        local_c0[bVar1].sum_feat_sq = local_b8[bVar1].sum_feat_sq;
        pkVar14 = &local_98;
        pfVar13 = local_b8 + bVar1;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pfVar13->values)._begin = (float *)*pkVar14;
          pkVar14 = pkVar14 + (ulong)bVar19 * -2 + 1;
          pfVar13 = (features *)((long)pfVar13 + (ulong)bVar19 * -0x10 + 8);
        }
        local_b8[bVar1].sum_feat_sq = local_38;
        pfVar13 = local_b8 + *local_e8;
        features::clear(pfVar13);
        pfVar17 = pfVar4[bVar1].values._begin;
        pfVar5 = pfVar4[bVar1].values._end;
        if (pfVar17 != pfVar5) {
          local_b0 = &pfVar13->space_names;
          puVar12 = (pfVar16->indicies)._begin + 1;
          this_00 = local_e0;
          pfVar17 = pfVar17 + 1;
          local_a0 = pfVar13;
          do {
            if (pfVar17 == pfVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: id feature namespace has ",0x22);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9," features. Should be a multiple of 2",0x24);
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              break;
            }
            if ((((pfVar17[-1] != 1.0) || (NAN(pfVar17[-1]))) || (*pfVar17 != 1.0)) ||
               (NAN(*pfVar17))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: bad id features, must have value 1.",0x2c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
              std::ostream::put('(');
              std::ostream::flush();
            }
            else {
              i = puVar12[-1] & local_a8;
              local_108 = (*puVar12 & local_a8) + (local_100->super_example_predict).ft_offset;
              iVar6 = std::
                      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(this_00,&local_108);
              if (iVar6.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                local_90._0_4_ = sm->initial_numerator;
                local_90._4_4_ = sm->initial_denominator;
                local_98 = local_108;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)this_00,&local_98);
                if (sm->compete == true) {
                  local_d0 = 0x3f800000;
                  local_d8 = 0;
                  local_c4 = 0x3f800000;
                  local_cc = 0;
                  uStack_c8 = 0;
                  local_98 = local_108;
                  local_80 = 0x3f80000000000000;
                  local_90 = 0;
                  local_88 = 0x3f800000;
                  local_84 = 0;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                            (local_f0,&local_98);
                }
              }
              pmVar7 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_108);
              local_f8 = pmVar7->first;
              pmVar7 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_108);
              pfVar4 = local_a0;
              fVar20 = (float)(local_f8 / pmVar7->second);
              local_f8 = (double)CONCAT44(local_f8._4_4_,fVar20);
              features::push_back(local_a0,fVar20,i);
              psVar3 = (pfVar16->space_names)._begin;
              if (psVar3 != (pfVar16->space_names)._end) {
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(local_b0,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)psVar3 +
                                        ((long)(pfVar4->values)._end - (long)(pfVar4->values)._begin
                                        ) * 8 + -0x20));
              }
              this = local_f0;
              this_00 = local_e0;
              if (sm->compete == true) {
                pmVar8 = std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)local_f0,&local_108);
                fVar20 = (pmVar8->first).weight;
                sm->average_pred = local_f8._0_4_ * fVar20 + sm->average_pred;
                sm->net_weight = fVar20 + sm->net_weight;
                pmVar8 = std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)this,&local_108);
                sm->net_feature_weight = (pmVar8->second).weight + sm->net_feature_weight;
                this_00 = local_e0;
              }
            }
            pfVar5 = (pfVar16->values)._end;
            puVar12 = puVar12 + 2;
            pfVar18 = pfVar17 + 1;
            pfVar17 = pfVar17 + 2;
          } while (pfVar18 != pfVar5);
        }
      }
      local_e8 = local_e8 + 1;
    } while (local_e8 != (local_100->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}